

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep.cc
# Opt level: O3

bool __thiscall DyndepLoader::LoadDyndeps(DyndepLoader *this,Node *node,DyndepFile *ddf,string *err)

{
  _Rb_tree_header *p_Var1;
  Edge *edge;
  long lVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  pointer ppEVar5;
  _Rb_tree_node_base *p_Var6;
  undefined8 *puVar7;
  long *plVar8;
  long *plVar9;
  _Base_ptr p_Var10;
  pointer ppEVar11;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  node->dyndep_pending_ = false;
  if (g_explaining == true) {
    LoadDyndeps();
  }
  bVar3 = LoadDyndepFile(this,node,ddf,err);
  if (bVar3) {
    ppEVar11 = (node->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppEVar5 = (node->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppEVar11 != ppEVar5) {
      p_Var1 = &(ddf->
                super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
                )._M_t._M_impl.super__Rb_tree_header;
      do {
        edge = *ppEVar11;
        if (edge->dyndep_ == node) {
          p_Var4 = (ddf->
                   super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
                   )._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var10 = &p_Var1->_M_header;
          if (p_Var4 != (_Base_ptr)0x0) {
            do {
              if (*(Edge **)(p_Var4 + 1) >= edge) {
                p_Var10 = p_Var4;
              }
              p_Var4 = (&p_Var4->_M_left)[*(Edge **)(p_Var4 + 1) < edge];
            } while (p_Var4 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
               ((Edge *)((_Rb_tree_header *)p_Var10)->_M_node_count <= edge)) {
              *(undefined1 *)((long)p_Var10 + 0x28) = 1;
              bVar3 = UpdateEdge(this,edge,(Dyndeps *)((long)p_Var10 + 0x28),err);
              if (bVar3) {
                ppEVar5 = (node->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
                goto LAB_0010eba1;
              }
              goto LAB_0010ee53;
            }
          }
          std::operator+(&local_70,"\'",
                         &(*(edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_start)->path_);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_70);
          local_b0 = &local_a0;
          plVar9 = plVar8 + 2;
          if ((long *)*plVar8 == plVar9) {
            local_a0 = *plVar9;
            lStack_98 = plVar8[3];
          }
          else {
            local_a0 = *plVar9;
            local_b0 = (long *)*plVar8;
          }
          local_a8 = plVar8[1];
          *plVar8 = (long)plVar9;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_b0,(ulong)(node->path_)._M_dataplus._M_p);
          local_90 = &local_80;
          plVar9 = plVar8 + 2;
          if ((long *)*plVar8 == plVar9) {
            local_80 = *plVar9;
            lStack_78 = plVar8[3];
          }
          else {
            local_80 = *plVar9;
            local_90 = (long *)*plVar8;
          }
          local_88 = plVar8[1];
          *plVar8 = (long)plVar9;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
          goto LAB_0010ed9f;
        }
LAB_0010eba1:
        ppEVar11 = ppEVar11 + 1;
      } while (ppEVar11 != ppEVar5);
    }
    bVar3 = true;
    for (p_Var6 = (ddf->
                  super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
                  )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 !=
        &(ddf->
         super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
         )._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      if (*(char *)&p_Var6[1]._M_parent == '\0') {
        lVar2 = *(long *)(p_Var6 + 1);
        std::operator+(&local_70,"dyndep file \'",&node->path_);
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
        local_b0 = &local_a0;
        plVar8 = puVar7 + 2;
        if ((long *)*puVar7 == plVar8) {
          local_a0 = *plVar8;
          lStack_98 = puVar7[3];
        }
        else {
          local_a0 = *plVar8;
          local_b0 = (long *)*puVar7;
        }
        local_a8 = puVar7[1];
        *puVar7 = plVar8;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_b0,*(ulong *)**(undefined8 **)(lVar2 + 0x28));
        local_90 = &local_80;
        plVar8 = puVar7 + 2;
        if ((long *)*puVar7 == plVar8) {
          local_80 = *plVar8;
          lStack_78 = puVar7[3];
        }
        else {
          local_80 = *plVar8;
          local_90 = (long *)*puVar7;
        }
        local_88 = puVar7[1];
        *puVar7 = plVar8;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
LAB_0010ed9f:
        plVar9 = plVar8 + 2;
        if ((long *)*plVar8 == plVar9) {
          local_40 = *plVar9;
          lStack_38 = plVar8[3];
          local_50 = &local_40;
        }
        else {
          local_40 = *plVar9;
          local_50 = (long *)*plVar8;
        }
        local_48 = plVar8[1];
        *plVar8 = (long)plVar9;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::operator=((string *)err,(string *)&local_50);
        if (local_50 != &local_40) {
          operator_delete(local_50,local_40 + 1);
        }
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        if (local_b0 != &local_a0) {
          operator_delete(local_b0,local_a0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        goto LAB_0010ee53;
      }
    }
  }
  else {
LAB_0010ee53:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool DyndepLoader::LoadDyndeps(Node* node, DyndepFile* ddf,
                               std::string* err) const {
  // We are loading the dyndep file now so it is no longer pending.
  node->set_dyndep_pending(false);

  // Load the dyndep information from the file.
  EXPLAIN("loading dyndep file '%s'", node->path().c_str());
  if (!LoadDyndepFile(node, ddf, err))
    return false;

  // Update each edge that specified this node as its dyndep binding.
  std::vector<Edge*> const& out_edges = node->out_edges();
  for (std::vector<Edge*>::const_iterator oe = out_edges.begin();
       oe != out_edges.end(); ++oe) {
    Edge* const edge = *oe;
    if (edge->dyndep_ != node)
      continue;

    DyndepFile::iterator ddi = ddf->find(edge);
    if (ddi == ddf->end()) {
      *err = ("'" + edge->outputs_[0]->path() + "' "
              "not mentioned in its dyndep file "
              "'" + node->path() + "'");
      return false;
    }

    ddi->second.used_ = true;
    Dyndeps const& dyndeps = ddi->second;
    if (!UpdateEdge(edge, &dyndeps, err)) {
      return false;
    }
  }

  // Reject extra outputs in dyndep file.
  for (DyndepFile::const_iterator oe = ddf->begin(); oe != ddf->end();
       ++oe) {
    if (!oe->second.used_) {
      Edge* const edge = oe->first;
      *err = ("dyndep file '" + node->path() + "' mentions output "
              "'" + edge->outputs_[0]->path() + "' whose build statement "
              "does not have a dyndep binding for the file");
      return false;
    }
  }

  return true;
}